

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

char * field_type_str(int type)

{
  if (type < 4) {
    if (type < -0xfee) {
      if (type == -0xfff) {
        return "NT_DT_STRING";
      }
      if (type == -0xfef) {
        return "NT_DT_POINTER";
      }
    }
    else {
      if (type == -0xfee) {
        return "NT_DT_CHAR_PTR";
      }
      if (type == -0xfed) {
        return "NT_DT_EXT_PTR";
      }
    }
  }
  else if (type < 0x10) {
    if (type == 4) {
      return "DT_INT16";
    }
    if (type == 8) {
      return "DT_INT32";
    }
  }
  else {
    if (type == 0x10) {
      return "DT_FLOAT32";
    }
    if (type == 0x100) {
      return "DT_INT8";
    }
  }
  return "DT_UNKNOWN";
}

Assistant:

char * field_type_str( int type )
{
   if( type == DT_INT8 )        return "DT_INT8";
   if( type == DT_INT16 )       return "DT_INT16";
   if( type == DT_INT32 )       return "DT_INT32";
   if( type == DT_FLOAT32 )     return "DT_FLOAT32";
   if( type == NT_DT_STRING )   return "NT_DT_STRING";
   if( type == NT_DT_POINTER )  return "NT_DT_POINTER";
   if( type == NT_DT_CHAR_PTR ) return "NT_DT_CHAR_PTR"; /* longest: 14 */
   if( type == NT_DT_EXT_PTR )  return "NT_DT_EXT_PTR";

   return "DT_UNKNOWN";  /* for DT_UNKNOWN, or as an else */
}